

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanosvg.h
# Opt level: O1

void nsvg__parseGradientStop(NSVGparser *p,char **attr)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  NSVGgradientData *pNVar4;
  NSVGgradientStop *pNVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  char *name;
  char **ppcVar9;
  
  iVar1 = p->attrHead;
  p->attr[iVar1].stopColor = 0;
  p->attr[iVar1].stopOpacity = 1.0;
  p->attr[iVar1].stopOffset = 0.0;
  name = *attr;
  if (name != (char *)0x0) {
    ppcVar9 = attr + 2;
    do {
      nsvg__parseAttr(p,name,ppcVar9[-1]);
      name = *ppcVar9;
      ppcVar9 = ppcVar9 + 2;
    } while (name != (char *)0x0);
  }
  pNVar4 = p->gradients;
  if (pNVar4 != (NSVGgradientData *)0x0) {
    iVar2 = pNVar4->nstops;
    pNVar4->nstops = iVar2 + 1;
    pNVar5 = (NSVGgradientStop *)realloc(pNVar4->stops,(long)iVar2 * 8 + 8);
    pNVar4->stops = pNVar5;
    if (pNVar5 != (NSVGgradientStop *)0x0) {
      uVar3 = pNVar4->nstops - 1;
      uVar8 = (ulong)uVar3;
      if (1 < pNVar4->nstops) {
        uVar8 = 0;
        do {
          if (p->attr[iVar1].stopOffset < pNVar5[uVar8].offset) goto LAB_00114ee7;
          uVar8 = uVar8 + 1;
        } while (uVar3 != uVar8);
        uVar8 = (ulong)uVar3;
      }
LAB_00114ee7:
      lVar6 = (long)(int)uVar8;
      if ((int)uVar8 < (int)uVar3) {
        lVar7 = (long)(int)uVar3;
        do {
          pNVar4->stops[lVar7] = pNVar4->stops[lVar7 + -1];
          lVar7 = lVar7 + -1;
        } while (lVar6 < lVar7);
      }
      pNVar5 = pNVar4->stops;
      uVar3 = p->attr[iVar1].stopColor;
      pNVar5[lVar6].color = uVar3;
      pNVar5[lVar6].color = (int)(long)(p->attr[iVar1].stopOpacity * 255.0) << 0x18 | uVar3;
      pNVar5[lVar6].offset = p->attr[iVar1].stopOffset;
    }
  }
  return;
}

Assistant:

static void nsvg__parseGradientStop(NSVGparser* p, const char** attr)
{
	NSVGattrib* curAttr = nsvg__getAttr(p);
	NSVGgradientData* grad;
	NSVGgradientStop* stop;
	int i, idx;

	curAttr->stopOffset = 0;
	curAttr->stopColor = 0;
	curAttr->stopOpacity = 1.0f;

	for (i = 0; attr[i]; i += 2) {
		nsvg__parseAttr(p, attr[i], attr[i + 1]);
	}

	// Add stop to the last gradient.
	grad = p->gradients;
	if (grad == NULL) return;

	grad->nstops++;
	grad->stops = (NSVGgradientStop*)realloc(grad->stops, sizeof(NSVGgradientStop)*grad->nstops);
	if (grad->stops == NULL) return;

	// Insert
	idx = grad->nstops-1;
	for (i = 0; i < grad->nstops-1; i++) {
		if (curAttr->stopOffset < grad->stops[i].offset) {
			idx = i;
			break;
		}
	}
	if (idx != grad->nstops-1) {
		for (i = grad->nstops-1; i > idx; i--)
			grad->stops[i] = grad->stops[i-1];
	}

	stop = &grad->stops[idx];
	stop->color = curAttr->stopColor;
	stop->color |= (unsigned int)(curAttr->stopOpacity*255) << 24;
	stop->offset = curAttr->stopOffset;
}